

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_aref(ASMState *as,IRIns *ir)

{
  Reg r1;
  ASMState *in_RSI;
  IRIns *in_RDI;
  Reg dest;
  ASMState *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  r1 = ra_dest(in_RSI,(IRIns *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
  asm_fusearef(unaff_retaddr,in_RDI,(RegSet)((ulong)in_RSI >> 0x20));
  if ((*(char *)((long)in_RDI + 0xa5) == -0x80) && (in_RDI[0x14].field_1.op12 == 0)) {
    if (*(byte *)((long)in_RDI + 0xa4) != r1) {
      emit_rr((ASMState *)&in_RDI->field_0,XO_MOV,r1,(uint)*(byte *)((long)in_RDI + 0xa4));
    }
  }
  else {
    emit_mrm((ASMState *)&in_RDI->field_0,XO_LEA,r1,0x20);
  }
  return;
}

Assistant:

static void asm_aref(ASMState *as, IRIns *ir)
{
  Reg dest = ra_dest(as, ir, RSET_GPR);
  asm_fusearef(as, ir, RSET_GPR);
  if (!(as->mrm.idx == RID_NONE && as->mrm.ofs == 0))
    emit_mrm(as, XO_LEA, dest|REX_GC64, RID_MRM);
  else if (as->mrm.base != dest)
    emit_rr(as, XO_MOV, dest|REX_GC64, as->mrm.base);
}